

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void check_trap(wasm_func_t *func,int i,wasm_val_t *args)

{
  long lVar1;
  wasm_val_t r;
  wasm_val_vec_t results;
  wasm_val_vec_t args_;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_20;
  undefined1 *local_18;
  long local_10;
  wasm_val_t *local_8;
  
  local_18 = (undefined1 *)&local_38;
  local_38 = 0x80;
  uStack_34 = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  local_10 = (long)i;
  local_20 = 1;
  local_8 = args;
  lVar1 = wasm_func_call();
  if (lVar1 != 0) {
    wasm_trap_delete(lVar1);
    return;
  }
  puts("> Error on result, expected trap");
  exit(1);
}

Assistant:

void check_trap(wasm_func_t* func, int i, wasm_val_t args[]) {
  wasm_val_t r = WASM_INIT_VAL;
  wasm_val_vec_t args_ = {i, args};
  wasm_val_vec_t results = {1, &r};
  own wasm_trap_t* trap = wasm_func_call(func, &args_, &results);
  if (! trap) {
    printf("> Error on result, expected trap\n");
    exit(1);
  }
  wasm_trap_delete(trap);
}